

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_alignof(lua_State *L)

{
  CTInfo CVar1;
  CTSize local_40;
  CTInfo info;
  CTSize sz;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  
  _sz = *(CTState **)((L->glref).ptr64 + 0x180);
  _sz->L = L;
  cts = (CTState *)L;
  L_local = (lua_State *)_sz;
  cts_1 = (CTState *)L;
  info = ffi_checkctype(L,_sz,(TValue *)0x0);
  local_40 = 0;
  CVar1 = lj_ctype_info_raw(_sz,info,&local_40);
  cts->miscmap[-1].freetop.ptr64 = (uint64_t)(double)(1 << ((byte)(CVar1 >> 0x10) & 0xf));
  return 1;
}

Assistant:

LJLIB_CF(ffi_alignof)	LJLIB_REC(ffi_xof FF_ffi_alignof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz = 0;
  CTInfo info = lj_ctype_info_raw(cts, id, &sz);
  setintV(L->top-1, 1 << ctype_align(info));
  return 1;
}